

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int get_parts(void)

{
  CURLUcode CVar1;
  int iVar2;
  CURLU *u;
  int local_1c;
  int error;
  CURLU *urlp;
  CURLUcode rc;
  int i;
  
  local_1c = 0;
  urlp._4_4_ = 0;
  while( true ) {
    if (get_parts_list[urlp._4_4_].in == (char *)0x0 || local_1c != 0) {
      return local_1c;
    }
    u = (CURLU *)curl_url();
    if (u == (CURLU *)0x0) break;
    CVar1 = curl_url_set(u,0,get_parts_list[urlp._4_4_].in,get_parts_list[urlp._4_4_].urlflags);
    if (CVar1 == get_parts_list[urlp._4_4_].ucode) {
      if ((get_parts_list[urlp._4_4_].ucode == CURLUE_OK) &&
         (iVar2 = checkparts(u,get_parts_list[urlp._4_4_].in,get_parts_list[urlp._4_4_].out,
                             get_parts_list[urlp._4_4_].getflags), iVar2 != 0)) {
        local_1c = local_1c + 1;
      }
    }
    else {
      curl_mfprintf(_stderr,"Get parts\nin: %s\nreturned %d (expected %d)\n",
                    get_parts_list[urlp._4_4_].in,CVar1,get_parts_list[urlp._4_4_].ucode);
      local_1c = local_1c + 1;
    }
    curl_url_cleanup(u);
    urlp._4_4_ = urlp._4_4_ + 1;
  }
  return local_1c + 1;
}

Assistant:

static int get_parts(void)
{
  int i;
  CURLUcode rc;
  CURLU *urlp;
  int error = 0;
  for(i = 0; get_parts_list[i].in && !error; i++) {
    urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    rc = curl_url_set(urlp, CURLUPART_URL,
                      get_parts_list[i].in,
                      get_parts_list[i].urlflags);
    if(rc != get_parts_list[i].ucode) {
      fprintf(stderr, "Get parts\nin: %s\nreturned %d (expected %d)\n",
              get_parts_list[i].in, (int)rc, get_parts_list[i].ucode);
      error++;
    }
    else if(get_parts_list[i].ucode) {
      /* the expected error happened */
    }
    else if(checkparts(urlp, get_parts_list[i].in, get_parts_list[i].out,
                       get_parts_list[i].getflags))
      error++;
    curl_url_cleanup(urlp);
  }
  return error;
}